

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_set_format.c
# Opt level: O1

void test_read_set_wrong_format(void)

{
  wchar_t wVar1;
  int iVar2;
  archive *_a;
  archive_entry *ae;
  char reffile [25];
  archive_entry *local_40;
  char local_38 [32];
  
  builtin_strncpy(local_38 + 0x10,"_zip.zip",9);
  builtin_strncpy(local_38,"test_read_format",0x10);
  extract_reference_file(local_38);
  _a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'm',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0
                  );
  wVar1 = archive_read_set_format(_a,L'\x000d0000');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'n',(uint)(wVar1 == L'\0'),
                   "0 == archive_read_set_format(a, ARCHIVE_FORMAT_RAR)",_a);
  iVar2 = archive_read_append_filter(_a,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'o',(uint)(iVar2 == 0),
                   "0 == archive_read_append_filter(a, ARCHIVE_FILTER_NONE)",_a);
  wVar1 = archive_read_open_filename(_a,local_38,0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'p',(uint)(wVar1 == L'\0'),"0 == archive_read_open_filename(a, reffile, 10240)"
                   ,_a);
  iVar2 = archive_read_next_header(_a,&local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L's',(uint)(iVar2 < -0x14),"archive_read_next_header(a, &ae) < (ARCHIVE_WARN)",
                   _a);
  iVar2 = archive_read_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L't',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",_a);
  iVar2 = archive_read_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'u',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_set_wrong_format)
{
  const char reffile[] = "test_read_format_zip.zip";
  struct archive_entry *ae;
  struct archive *a;

  extract_reference_file(reffile);
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_set_format(a, ARCHIVE_FORMAT_RAR));
  assertA(0 == archive_read_append_filter(a, ARCHIVE_FILTER_NONE));
  assertA(0 == archive_read_open_filename(a, reffile, 10240));

  /* Check that this actually fails, then close the archive. */
  assertA(archive_read_next_header(a, &ae) < (ARCHIVE_WARN));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}